

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::dfsForDeterm(Graph *this,uint64_t v,uint64_t *timer,uint64_t backward)

{
  value_type vVar1;
  unsigned_long uVar2;
  ulong uVar3;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  reference this_00;
  reference puVar7;
  reference pvVar8;
  unsigned_long *puVar9;
  size_type local_70;
  size_type local_58;
  uint64_t vertex;
  value_type *e;
  unsigned_long index;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  uint64_t backward_local;
  uint64_t *timer_local;
  uint64_t v_local;
  Graph *this_local;
  
  timer_local = (uint64_t *)v;
  v_local = (uint64_t)this;
  pvVar5 = std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>::operator[](&this->colorMap,v)
  ;
  if (*pvVar5 == White) {
    pvVar5 = std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>::operator[]
                       (&this->colorMap,(size_type)timer_local);
    *pvVar5 = Grey;
    vVar1 = *timer;
    *timer = vVar1 + 1;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->time_minimal,(size_type)timer_local);
    *pvVar6 = vVar1;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->time_discover,(size_type)timer_local);
    *pvVar6 = vVar1;
    this_00 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator[](&this->matrix,(size_type)timer_local);
    __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_00);
    index = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&index), bVar4) {
      puVar7 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end1);
      e = (value_type *)*puVar7;
      vertex = (uint64_t)
               std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::operator[]
                         (&this->edges,(size_type)e);
      if ((uint64_t *)(((reference)vertex)->super_LightEdge).v == timer_local) {
        local_70 = (((reference)vertex)->super_LightEdge).u;
      }
      else {
        local_70 = (((reference)vertex)->super_LightEdge).v;
      }
      local_58 = local_70;
      if (local_70 != backward) {
        pvVar5 = std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>::operator[]
                           (&this->colorMap,local_70);
        if (*pvVar5 == Grey) {
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->time_minimal,(size_type)timer_local);
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->time_discover,local_58);
          puVar9 = std::min<unsigned_long>(pvVar6,pvVar8);
          uVar2 = *puVar9;
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->time_minimal,(size_type)timer_local);
          *pvVar6 = uVar2;
        }
        else {
          dfsForDeterm(this,local_58,timer,(uint64_t)timer_local);
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->time_minimal,(size_type)timer_local);
          pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->time_minimal,local_58);
          puVar9 = std::min<unsigned_long>(pvVar6,pvVar8);
          uVar2 = *puVar9;
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->time_minimal,(size_type)timer_local);
          *pvVar6 = uVar2;
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->time_minimal,local_58);
          uVar3 = *pvVar6;
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->time_discover,(size_type)timer_local);
          if (*pvVar6 < uVar3) {
            std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>::
            emplace_back<unsigned_long&,unsigned_long&>
                      ((vector<Graph::LightEdge,std::allocator<Graph::LightEdge>> *)&this->bridges,
                       &local_58,(unsigned_long *)&timer_local);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end1);
    }
    pvVar5 = std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>::operator[]
                       (&this->colorMap,(size_type)timer_local);
    *pvVar5 = Black;
  }
  return;
}

Assistant:

void Graph::dfsForDeterm(std::uint64_t v, std::uint64_t &timer,
                         std::uint64_t backward) {
    if (colorMap[v] != Colors::White)
        return;

    colorMap[v] = Colors::Grey;
    time_discover[v] = time_minimal[v] = timer++;
    for (auto index : matrix[v]) {
        auto &e = edges[index];
        std::uint64_t vertex = (e.v == v) ? e.u : e.v;

        if (vertex == backward)
            continue;
        if (colorMap[vertex] == Colors::Grey) {
            time_minimal[v] = std::min(time_minimal[v], time_discover[vertex]);
        } else {
            Graph::dfsForDeterm(vertex, timer, v);
            time_minimal[v] = std::min(time_minimal[v], time_minimal[vertex]);
            if (time_minimal[vertex] > time_discover[v])
                bridges.emplace_back(vertex, v);
        }
    }
    colorMap[v] = Colors::Black;
}